

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

void __thiscall
google::protobuf::RepeatedField<bool>::InternalDeallocate<true>(RepeatedField<bool> *this)

{
  int iVar1;
  anon_union_8_2_a06a818b_for_HeapRep<8UL>_1 *paVar2;
  HeapRep *pHVar3;
  int *key;
  RepeatedField<bool> *this_00;
  RepeatedPtrFieldBase *this_01;
  iterator iVar4;
  undefined1 auStack_38 [8];
  undefined8 uStack_30;
  RepeatedField<bool> local_20;
  
  if ((undefined1  [16])((undefined1  [16])(this->soo_rep_).field_0 & (undefined1  [16])0x4) ==
      (undefined1  [16])0x0) {
    this_00 = &local_20;
    uStack_30 = internal::RepeatedPtrFieldBase::
                Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>;
    InternalDeallocate<true>(this_00);
    key = (int *)(this_00->soo_rep_).field_0.long_rep.elements_int;
    if (key != (int *)0x0) {
      internal::RepeatedPtrFieldBase::
      Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>();
      return;
    }
    this_01 = (RepeatedPtrFieldBase *)auStack_38;
    internal::RepeatedPtrFieldBase::
    Destroy<google::protobuf::internal::GenericTypeHandler<std::__cxx11::string>>(this_01);
    iVar4 = absl::lts_20240722::container_internal::
            btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
            ::internal_find<int>
                      ((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
                        *)this_01,key);
    if (iVar4.node_ ==
        (btree_node<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
         *)0x0) {
      absl::lts_20240722::container_internal::
      btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
      ::end((btree<absl::lts_20240722::container_internal::map_params<int,_google::protobuf::internal::ExtensionSet::Extension,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_256,_false>_>
             *)this_01);
    }
    return;
  }
  iVar1 = (this->soo_rep_).field_0.long_rep.capacity;
  uStack_30._0_4_ = 0x147a54;
  uStack_30._4_4_ = 0;
  paVar2 = &heap_rep(this)->field_0;
  if (paVar2->arena != (Arena *)0x0) {
    return;
  }
  uStack_30._0_4_ = 0x147a6e;
  uStack_30._4_4_ = 0;
  pHVar3 = heap_rep(this);
  operator_delete(pHVar3,(long)iVar1 + 8);
  return;
}

Assistant:

bool is_soo() const { return (arena_and_size & kNotSooBit) == 0; }